

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceGeometry_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function)

{
  bool bVar1;
  RenderContext *pRVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  char *local_200;
  string local_1d0;
  deUint32 local_1b0;
  ContextType local_19c;
  ostringstream local_198 [8];
  ostringstream source;
  ShaderFunction function_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  std::__cxx11::ostringstream::ostringstream(local_198);
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  local_19c.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_1b0 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_19c,(ApiType)local_1b0);
  if (bVar1) {
    local_200 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_200 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar3 = std::operator<<((ostream *)local_198,local_200);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1d0,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  if (shaderType == 0xe) {
    std::operator<<((ostream *)local_198,"    EmitVertex();\n");
  }
  else if (shaderType == 0xf) {
    std::operator<<((ostream *)local_198,"    EndPrimitive();\n");
  }
  std::operator<<((ostream *)local_198,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceGeometry (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function)
{
	DE_ASSERT(function == SHADER_FUNCTION_EMIT_VERTEX || function == SHADER_FUNCTION_END_PRIMITIVE);

	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n";

	switch (function)
	{
		case SHADER_FUNCTION_EMIT_VERTEX:
			source << "    EmitVertex();\n";
			break;

		case SHADER_FUNCTION_END_PRIMITIVE:
			source << "    EndPrimitive();\n";
			break;

		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}